

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * mi_malloc_small(size_t size)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)((long)(*(mi_heap_t **)(in_FS_OFFSET + -0x60))->pages_free_direct +
                   (size + 7 & 0xfffffffffffffff8));
  puVar2 = *(undefined8 **)(lVar1 + 0x10);
  if (puVar2 != (undefined8 *)0x0) {
    *(undefined8 *)(lVar1 + 0x10) = *puVar2;
    *(short *)(lVar1 + 0x20) = *(short *)(lVar1 + 0x20) + 1;
    return puVar2;
  }
  pvVar3 = _mi_malloc_generic(*(mi_heap_t **)(in_FS_OFFSET + -0x60),size,false,0);
  return pvVar3;
}

Assistant:

void* mi_malloc_small(size_t size) mi_attr_noexcept {
  return mi_heap_malloc_small(mi_prim_get_default_heap(), size);
}